

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderCompiler.cpp
# Opt level: O3

void signal_handler(int sig)

{
  int iVar1;
  undefined8 uVar2;
  
  g_Terminate = true;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&g_ReportMutex);
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SIGINT received, terminating",0x1c);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x10');
    std::ostream::put('\x10');
    std::ostream::flush();
    pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  pthread_mutex_unlock((pthread_mutex_t *)&g_ReportMutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void signal_handler(int sig)
{
	(void)sig;

	g_Terminate = true;

	lock_guard<mutex> guard(g_ReportMutex);
	cout << "SIGINT received, terminating" << endl;
}